

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font.cc
# Opt level: O3

bool woff2::ReadTrueTypeFont(Buffer *file,uint8_t *data,size_t len,Font *font)

{
  ulong uVar1;
  uint uVar2;
  _Rb_tree_color _Var3;
  ulong uVar4;
  size_t sVar5;
  uint8_t *puVar6;
  mapped_type *pmVar7;
  mapped_type *pmVar8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  _Rb_tree_header *p_Var11;
  uint uVar12;
  _Rb_tree_color _Var13;
  ushort uVar14;
  bool bVar15;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  intervals;
  _Rb_tree_color local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint8_t *local_90;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  Table *pTStack_70;
  uint8_t local_68;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  local_60;
  
  uVar4 = file->length_;
  sVar5 = file->offset_;
  uVar1 = sVar5 + 2;
  if (uVar4 < uVar1) {
    return false;
  }
  uVar14 = *(ushort *)(file->buffer_ + sVar5);
  font->num_tables = uVar14 << 8 | uVar14 >> 8;
  file->offset_ = uVar1;
  if (uVar4 - 6 < uVar1 || uVar4 < sVar5 + 8) {
    return false;
  }
  file->offset_ = sVar5 + 8;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (uVar14 != 0) {
    p_Var11 = &(font->tables)._M_t._M_impl.super__Rb_tree_header;
    uVar14 = 0;
    do {
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pTStack_70 = (Table *)0x0;
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68 = '\0';
      uVar1 = file->length_;
      sVar5 = file->offset_;
      if (uVar1 < sVar5 + 4) goto LAB_00105f4c;
      puVar6 = file->buffer_;
      uVar2 = *(uint *)(puVar6 + sVar5);
      local_a0 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      file->offset_ = sVar5 + 4;
      if (uVar1 < sVar5 + 8) goto LAB_00105f4c;
      uVar2 = *(uint *)(puVar6 + sVar5 + 4);
      uStack_9c = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      file->offset_ = sVar5 + 8;
      uVar4 = sVar5 + 0xc;
      if (uVar1 < uVar4) goto LAB_00105f4c;
      uVar2 = *(uint *)(puVar6 + sVar5 + 8);
      uStack_98 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      file->offset_ = uVar4;
      if (uVar1 < sVar5 + 0x10) goto LAB_00105f4c;
      uVar12 = *(uint *)(puVar6 + uVar4);
      uVar12 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
      file->offset_ = sVar5 + 0x10;
      uStack_94 = uVar12;
      if ((((uVar2 >> 0x18 & 3) != 0) || (len < uVar12)) || (len - uVar12 < (ulong)uStack_98))
      goto LAB_00105f4c;
      pmVar7 = std::
               map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                             *)&local_60,&uStack_98);
      *pmVar7 = uVar12;
      local_90 = data + uStack_98;
      p_Var9 = (font->tables)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var10 = &p_Var11->_M_header;
      if (p_Var9 != (_Base_ptr)0x0) {
        do {
          bVar15 = p_Var9[1]._M_color < local_a0;
          if (!bVar15) {
            p_Var10 = p_Var9;
          }
          p_Var9 = (&p_Var9->_M_left)[bVar15];
        } while (p_Var9 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var10 != p_Var11) && (p_Var10[1]._M_color <= local_a0)) {
          if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_88.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          goto LAB_00105f4c;
        }
      }
      pmVar8 = std::
               map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
               ::operator[](&font->tables,&local_a0);
      pmVar8->data = local_90;
      pmVar8->tag = local_a0;
      pmVar8->checksum = uStack_9c;
      pmVar8->offset = uStack_98;
      pmVar8->length = uStack_94;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&pmVar8->buffer,&local_88);
      pmVar8->flag_byte = local_68;
      pmVar8->reuse_of = pTStack_70;
      if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < font->num_tables);
    p_Var11 = &local_60._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left != p_Var11) {
      _Var13 = (uint)font->num_tables << 4 | 0xc;
      p_Var9 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        _Var3 = p_Var9[1]._M_color;
        if ((_Var3 < _Var13) ||
           (_Var13 = _Var3 + *(int *)&p_Var9[1].field_0x4,
           CARRY4(_Var3,*(uint *)&p_Var9[1].field_0x4))) goto LAB_00105f4c;
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
      } while ((_Rb_tree_header *)p_Var9 != p_Var11);
    }
  }
  p_Var9 = (font->tables)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var9 != (_Base_ptr)0x0) {
    p_Var11 = &(font->tables)._M_t._M_impl.super__Rb_tree_header;
    p_Var10 = &p_Var11->_M_header;
    do {
      bVar15 = p_Var9[1]._M_color < 0x68656164;
      if (!bVar15) {
        p_Var10 = p_Var9;
      }
      p_Var9 = (&p_Var9->_M_left)[bVar15];
    } while (p_Var9 != (_Base_ptr)0x0);
    if ((((_Rb_tree_header *)p_Var10 != p_Var11) && (p_Var10[1]._M_color < 0x68656165)) &&
       (*(uint *)((long)&p_Var10[1]._M_left + 4) < 0x34)) {
LAB_00105f4c:
      bVar15 = false;
      goto LAB_00105f4e;
    }
  }
  bVar15 = true;
LAB_00105f4e:
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::~_Rb_tree(&local_60);
  return bVar15;
}

Assistant:

bool ReadTrueTypeFont(Buffer* file, const uint8_t* data, size_t len,
                      Font* font) {
  // We don't care about the search_range, entry_selector and range_shift
  // fields, they will always be computed upon writing the font.
  if (!file->ReadU16(&font->num_tables) ||
      !file->Skip(6)) {
    return FONT_COMPRESSION_FAILURE();
  }

  std::map<uint32_t, uint32_t> intervals;
  for (uint16_t i = 0; i < font->num_tables; ++i) {
    Font::Table table;
    table.flag_byte = 0;
    table.reuse_of = NULL;
    if (!file->ReadU32(&table.tag) ||
        !file->ReadU32(&table.checksum) ||
        !file->ReadU32(&table.offset) ||
        !file->ReadU32(&table.length)) {
      return FONT_COMPRESSION_FAILURE();
    }
    if ((table.offset & 3) != 0 ||
        table.length > len ||
        len - table.length < table.offset) {
      return FONT_COMPRESSION_FAILURE();
    }
    intervals[table.offset] = table.length;
    table.data = data + table.offset;
    if (font->tables.find(table.tag) != font->tables.end()) {
      return FONT_COMPRESSION_FAILURE();
    }
    font->tables[table.tag] = table;
  }

  // Check that tables are non-overlapping.
  uint32_t last_offset = 12UL + 16UL * font->num_tables;
  for (const auto& i : intervals) {
    if (i.first < last_offset || i.first + i.second < i.first) {
      return FONT_COMPRESSION_FAILURE();
    }
    last_offset = i.first + i.second;
  }

  // Sanity check key tables
  const Font::Table* head_table = font->FindTable(kHeadTableTag);
  if (head_table != NULL && head_table->length < 52) {
    return FONT_COMPRESSION_FAILURE();
  }

  return true;
}